

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toktx.cc
# Opt level: O3

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
toktxApp::createImage(toktxApp *this,targetImageSpec *target,ImageInput *in)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  ktx_uint32_t height;
  undefined4 uVar4;
  undefined1 uVar8;
  undefined3 uVar10;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar11;
  bool bVar12;
  uint32_t uVar13;
  int iVar14;
  int iVar15;
  FormatDescriptor *this_00;
  ImageT<unsigned_short,_4U> *this_01;
  undefined4 extraout_var;
  ostream *poVar16;
  runtime_error *this_02;
  long *in_RCX;
  long lVar17;
  uint32_t k;
  long lVar18;
  long lVar19;
  ImageT<unsigned_short,_4U> *pIVar20;
  float *pfVar21;
  uint32_t j;
  long lVar22;
  float *pfVar23;
  float fVar24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bits;
  ImageT<unsigned_short,_4U> *local_258;
  ImageT<unsigned_short,_4U> *local_250;
  _func_int **local_248 [2];
  uint32_t uStack_238;
  undefined4 uStack_234;
  float local_230;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_208;
  vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> vStack_1f0;
  string local_1d8 [32];
  undefined1 local_1b8 [16];
  pointer local_1a8;
  undefined4 uVar9;
  
  this_00 = (FormatDescriptor *)(**(code **)(*in_RCX + 0x70))();
  local_228._M_p = (pointer)&local_218;
  local_220 = 0;
  local_218._M_local_buf[0] = '\0';
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_1f0.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_1f0.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_1f0.super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
  if (*(uint32_t *)&in->field_0x10 == (this_00->extended).channelCount) {
    local_248[0] = in->_vptr_ImageInput;
    local_248[1]._0_5_ = (undefined5)*(undefined8 *)&in->file;
    local_248[1]._5_3_ = (undefined3)((ulong)*(undefined8 *)&in->file >> 0x28);
    local_230 = *(float *)&in->field_0x18;
    uStack_238 = (uint32_t)*(undefined8 *)&in->field_0x10;
    uStack_234 = (undefined4)((ulong)*(undefined8 *)&in->field_0x10 >> 0x20);
    std::__cxx11::string::_M_assign((string *)&local_228);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_208,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&in->field_0x40);
    std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::operator=
              (&vStack_1f0,
               (vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_> *)
               &in->field_0x58);
  }
  else {
    local_248[0] = *(_func_int ***)&this_00->basic;
    uVar11 = *(undefined8 *)&(this_00->basic).field_0x8;
    local_248[1]._0_5_ = (undefined5)uVar11;
    local_248[1]._5_3_ = (undefined3)((ulong)uVar11 >> 0x28);
    local_230 = (this_00->extended).oeGamma;
    uVar4 = (this_00->extended).channelCount;
    uVar8 = (this_00->extended).sameUnitAllChannels;
    uVar10 = *(undefined3 *)&(this_00->extended).field_0x5;
    uVar9 = CONCAT31(uVar10,uVar8);
    uStack_238 = uVar4;
    uStack_234 = uVar9;
    std::__cxx11::string::_M_assign((string *)&local_228);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&local_208,&(this_00->extended).iccProfile.profile);
    std::vector<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>::operator=
              (&vStack_1f0,&this_00->samples);
    uVar13 = FormatDescriptor::channelBitLength((FormatDescriptor *)in);
    bVar12 = FormatDescriptor::anyChannelBitLengthNotEqual(this_00,uVar13);
    if (bVar12) {
      local_1b8._0_8_ = (ImageT<unsigned_short,_4U> *)0x0;
      local_1b8._8_8_ = (pointer)0x0;
      local_1a8 = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8,1);
      uVar13 = FormatDescriptor::channelBitLength((FormatDescriptor *)in);
      *(uint32_t *)&((Image *)local_1b8._0_8_)->_vptr_Image = uVar13;
      FormatDescriptor::updateSampleBitCounts
                ((FormatDescriptor *)local_248,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1b8);
      if ((ImageT<unsigned_short,_4U> *)local_1b8._0_8_ != (ImageT<unsigned_short,_4U> *)0x0) {
        operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
      }
    }
  }
  uVar13 = FormatDescriptor::channelBitLength((FormatDescriptor *)local_248);
  if (uVar13 != 0x10) {
    uVar13 = FormatDescriptor::channelBitLength((FormatDescriptor *)in);
    if (uVar13 != 8) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      bVar1 = ((this_00->samples).
               super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
               ._M_impl.super__Vector_impl_data._M_start)->field_0x3;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Unsupported format ",0x13);
      FormatDescriptor::channelBitLength(this_00);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16,"-bit ",5);
      poVar16 = (ostream *)std::ostream::operator<<(poVar16,bVar1 & 0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," needed.",8);
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_02,local_1d8);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    switch(uStack_238) {
    case 1:
      uVar13 = *(uint32_t *)&this_00[1].basic;
      uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
      this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_1U>::ImageT((ImageT<unsigned_char,_1U> *)this_01,uVar13,uVar2);
      break;
    case 2:
      uVar13 = *(uint32_t *)&this_00[1].basic;
      uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
      this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_2U>::ImageT((ImageT<unsigned_char,_2U> *)this_01,uVar13,uVar2);
      break;
    case 3:
      uVar13 = *(uint32_t *)&this_00[1].basic;
      uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
      this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_3U>::ImageT((ImageT<unsigned_char,_3U> *)this_01,uVar13,uVar2);
      break;
    case 4:
      uVar13 = *(uint32_t *)&this_00[1].basic;
      uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
      this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
      ImageT<unsigned_char,_4U>::ImageT((ImageT<unsigned_char,_4U> *)this_01,uVar13,uVar2);
      break;
    default:
      goto switchD_0011015b_default;
    }
    goto LAB_001102f3;
  }
  switch(uStack_238) {
  case 1:
    uVar13 = *(uint32_t *)&this_00[1].basic;
    uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
    this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
    ImageT<unsigned_short,_1U>::ImageT((ImageT<unsigned_short,_1U> *)this_01,uVar13,uVar2);
    break;
  case 2:
    uVar13 = *(uint32_t *)&this_00[1].basic;
    uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
    this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
    ImageT<unsigned_short,_2U>::ImageT((ImageT<unsigned_short,_2U> *)this_01,uVar13,uVar2);
    break;
  case 3:
    uVar13 = *(uint32_t *)&this_00[1].basic;
    uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
    this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
    ImageT<unsigned_short,_3U>::ImageT((ImageT<unsigned_short,_3U> *)this_01,uVar13,uVar2);
    break;
  case 4:
    uVar13 = *(uint32_t *)&this_00[1].basic;
    uVar2 = *(uint32_t *)&this_00[1].basic.field_0x4;
    this_01 = (ImageT<unsigned_short,_4U> *)operator_new(0x28);
    ImageT<unsigned_short,_4U>::ImageT(this_01,uVar13,uVar2);
    break;
  default:
switchD_0011015b_default:
    this_01 = (ImageT<unsigned_short,_4U> *)0x0;
    goto LAB_001102f6;
  }
LAB_001102f3:
  (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)this_01;
LAB_001102f6:
  (*(this_01->super_Image)._vptr_Image[2])(this_01);
  (*(this_01->super_Image)._vptr_Image[3])(this_01);
  (**(code **)(*in_RCX + 0xb8))();
  uVar13 = (this_01->super_Image).width;
  uVar2 = (this_01->super_Image).height;
  iVar14 = (*(this_01->super_Image)._vptr_Image[4])(this_01);
  iVar15 = (*(this_01->super_Image)._vptr_Image[3])();
  if (CONCAT44(extraout_var,iVar15) != (ulong)(uVar2 * uVar13 * iVar14)) {
    __assert_fail("image->getWidth() * image->getHeight() * image->getPixelSize() == image->getByteCount()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                  ,0x440,
                  "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)");
  }
  lVar5 = *(long *)&in->field_0x90;
  if (lVar5 != 0) {
    lVar6 = *(long *)&in->field_0x88;
    if (lVar6 == 0) {
      __assert_fail("target.srcTransferFunction != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                    ,0x445,
                    "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)"
                   );
    }
    lVar7 = *(long *)&in->field_0xa0;
    if (lVar7 == 0) {
      (*(this_01->super_Image)._vptr_Image[0x13])(this_01,lVar6,lVar5,0);
    }
    else {
      lVar17 = *(long *)&in->field_0x98;
      if (lVar17 == 0) {
        __assert_fail("target.srcColorPrimaries != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/toktx/toktx.cc"
                      ,0x447,
                      "unique_ptr<Image> toktxApp::createImage(const targetImageSpec &, ImageInput &)"
                     );
      }
      lVar19 = 0;
      do {
        lVar22 = 0;
        pfVar21 = (float *)(lVar7 + 0x24);
        do {
          fVar24 = 0.0;
          lVar18 = 0;
          pfVar23 = pfVar21;
          do {
            fVar24 = fVar24 + *(float *)(lVar17 + lVar18 * 4) * *pfVar23;
            lVar18 = lVar18 + 1;
            pfVar23 = pfVar23 + 3;
          } while (lVar18 != 3);
          *(float *)(local_1b8 + lVar22 * 4 + lVar19 * 0xc) = fVar24;
          lVar22 = lVar22 + 1;
          pfVar21 = pfVar21 + 1;
        } while (lVar22 != 3);
        lVar19 = lVar19 + 1;
        lVar17 = lVar17 + 0xc;
      } while (lVar19 != 3);
      (*(this_01->super_Image)._vptr_Image[0x13])(this_01,lVar6,lVar5,local_1b8);
    }
  }
  uVar3 = *(uint *)&in->_vptr_ImageInput;
  (this_01->super_Image).primaries = uVar3 >> 8 & KHR_DF_PRIMARIES_MAX;
  (this_01->super_Image).transferFunction = uVar3 >> 0x10 & KHR_DF_TRANSFER_MAX;
  fVar24 = *(float *)((long)&target[4].super_ImageSpec.formatDesc.extended.iccProfile.profile.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish + 4);
  if ((fVar24 != 1.0) || (NAN(fVar24))) {
    uVar3 = (this_01->super_Image).width;
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    local_250 = this_01;
    scaleImage((toktxApp *)local_1b8,(unique_ptr<Image,_std::default_delete<Image>_> *)target,
               (ktx_uint32_t)&local_250,(ktx_uint32_t)(long)((float)uVar3 * fVar24));
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)local_1b8._0_8_;
    pIVar20 = local_250;
  }
  else {
    if ((*(int *)&target[4].super_ImageSpec.formatDesc.extended.iccProfile.profile.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == 0) ||
       ((height = *(ktx_uint32_t *)&in->field_0x70, (this_01->super_Image).width == height &&
        ((this_01->super_Image).height == *(uint32_t *)&in->field_0x74)))) goto LAB_00110516;
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    local_258 = this_01;
    scaleImage((toktxApp *)local_1b8,(unique_ptr<Image,_std::default_delete<Image>_> *)target,
               (ktx_uint32_t)&local_258,height);
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)local_1b8._0_8_;
    pIVar20 = local_258;
  }
  this_01 = (ImageT<unsigned_short,_4U> *)local_1b8._0_8_;
  if (pIVar20 != (ImageT<unsigned_short,_4U> *)0x0) {
    (*(pIVar20->super_Image)._vptr_Image[1])();
  }
LAB_00110516:
  if (target[4].usedInputTransferFunction != KHR_DF_TRANSFER_UNSPECIFIED) {
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)0x0;
    convertImageType((toktxApp *)local_1b8,(unique_ptr<Image,_std::default_delete<Image>_> *)target)
    ;
    (this->super_scApp).super_ktxApp._vptr_ktxApp = (_func_int **)local_1b8._0_8_;
    if (this_01 != (ImageT<unsigned_short,_4U> *)0x0) {
      (*(this_01->super_Image)._vptr_Image[1])();
    }
  }
  if (vStack_1f0.
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_1f0.
                    super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_1f0.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_1f0.
                          super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p != &local_218) {
    operator_delete(local_228._M_p,
                    CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]) + 1);
  }
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

unique_ptr<Image>
toktxApp::createImage(const targetImageSpec& target, ImageInput& in)
{
    const ImageSpec& inSpec = in.spec();
    FormatDescriptor inputFormat;
    unique_ptr<Image> image;

    // input plugins that support channel reduction and addition do so
    // in a way which differs from the documented behaviour for --target_type
    // so alway do channel adjustments in this program.
    if (target.format().channelCount() != inSpec.format().channelCount()) {
        // Have plugin deliver all channels.
        inputFormat = inSpec.format();
        if (inSpec.format().anyChannelBitLengthNotEqual(target.format().channelBitLength())) {
            // target.format() is set so all channels have same bit length.
            std::vector<uint32_t> bits;
            bits.resize(1);
            bits[0] = target.format().channelBitLength();
            // TODO: Consider making a function for channelBitCounts.
            // Currently supported input formats all have
            // numChannels = numSamples so this works but is fragile.
            inputFormat.updateSampleBitCounts(bits);
        }
    } else {
        inputFormat = target.format();
    }
    //if (target.format().channelBitLength() == 16) {
    if (inputFormat.channelBitLength() == 16) {
        switch (inputFormat.channelCount()) {
          case 1: {
            image = make_unique<r16image>(inSpec.width(), inSpec.height());
            break;
          } case 2: {
            image = make_unique<rg16image>(inSpec.width(), inSpec.height());
            break;
          } case 3: {
            image = make_unique<rgb16image>(inSpec.width(), inSpec.height());
            break;
          } case 4: {
            image = make_unique<rgba16image>(inSpec.width(), inSpec.height());
            break;
          }
        }
    } else if (target.format().channelBitLength() == 8) {
        switch (inputFormat.channelCount()) {
          case 1: {
            image = make_unique<r8image>(inSpec.width(), inSpec.height());
            break;
          } case 2: {
            image = make_unique<rg8image>(inSpec.width(), inSpec.height());
            break;
          } case 3: {
            image = make_unique<rgb8image>(inSpec.width(), inSpec.height());
            break;
          } case 4: {
            image = make_unique<rgba8image>(inSpec.width(), inSpec.height());
            break;
          }
        }
    } else {
        stringstream message;
        uint32_t ct = inSpec.format().samples[0].channelType;
        khr_df_sample_datatype_qualifiers_e dtq;
        dtq = static_cast<khr_df_sample_datatype_qualifiers_e>(ct);
        message << "Unsupported format "
                << inSpec.format().channelBitLength()
                << "-bit " << dtq << " needed.";
        throw runtime_error(message.str());
        // TODO: uint32, uint64, float etc.
    }

    in.readImage(static_cast<uint8_t*>(*image), image->getByteCount(),
                  0/*subimage*/, 0/*miplevel*/, inputFormat);
    /* Sanity check. */
    assert(image->getWidth() * image->getHeight() * image->getPixelSize()
           == image->getByteCount());



    if (target.dstTransferFunction != nullptr) {
        assert(target.srcTransferFunction != nullptr);
        if (target.dstColorPrimaries != nullptr) {
            assert(target.srcColorPrimaries != nullptr);
            auto primaryTransform = target.srcColorPrimaries->transformTo(*target.dstColorPrimaries);

            // Transform OETF with primary transform
            image->transformColorSpace(*target.srcTransferFunction, *target.dstTransferFunction, &primaryTransform);
        } else {
            // Transform OETF without primary transform
            image->transformColorSpace(*target.srcTransferFunction, *target.dstTransferFunction);
        }
    }
    image->setPrimaries((khr_df_primaries_e)target.format().primaries());
    image->setTransferFunction((khr_df_transfer_e)target.format().transfer());

    if (options.scale != 1.0f) {
        auto scaledWidth = image->getWidth() * options.scale;
        auto scaledHeight = image->getHeight() * options.scale;
        image = scaleImage(std::move(image),
               static_cast<ktx_uint32_t>(scaledWidth),
               static_cast<ktx_uint32_t>(scaledHeight));
    } else if (options.resize
               && (image->getWidth() != target.width()
                   || image->getHeight() != target.height()))
    {
        // --resize is not allowed with --mipmap so createImage will never be
        // called for other than the base level when set. This would be
        // incorrect otherwise. target reflects the resize value, if any.
        image = scaleImage(std::move(image), target.width(), target.height());
    }
    if (options.targetType != commandOptions::eUnspecified) {
        image = convertImageType(std::move(image));
    }
    return image;
}